

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhash_write_header(lhash_kv_engine *pEngine,unqlite_page *pHeader)

{
  uchar *buf;
  sxu32 nb;
  lhash_bmap_page *pMap;
  uchar *zRaw;
  unqlite_page *pHeader_local;
  lhash_kv_engine *pEngine_local;
  
  buf = pHeader->zData;
  pEngine->pHeader = pHeader;
  SyBigEndianPack32(buf,pEngine->nMagic);
  nb = (*pEngine->xHash)("chm@symisc",10);
  SyBigEndianPack32(buf + 4,nb);
  SyBigEndianPack64(buf + 8,0);
  SyBigEndianPack64(buf + 0x10,pEngine->split_bucket);
  SyBigEndianPack64(buf + 0x18,pEngine->max_split_bucket);
  (pEngine->sPageMap).iNum = pHeader->iPage;
  SyBigEndianPack64(buf + 0x20,0);
  SyBigEndianPack32(buf + 0x28,0);
  (pEngine->sPageMap).iPtr = ((short)buf + 0x2c) - (short)pHeader->zData;
  return 0;
}

Assistant:

static int lhash_write_header(lhash_kv_engine *pEngine,unqlite_page *pHeader)
{
	unsigned char *zRaw = pHeader->zData;
	lhash_bmap_page *pMap;

	pEngine->pHeader = pHeader;
	/* 4 byte magic number */
	SyBigEndianPack32(zRaw,pEngine->nMagic);
	zRaw += 4;
	/* 4 byte hash value to identify a valid hash function */
	SyBigEndianPack32(zRaw,pEngine->xHash(L_HASH_WORD,sizeof(L_HASH_WORD)-1));
	zRaw += 4;
	/* List of free pages: Empty */
	SyBigEndianPack64(zRaw,0);
	zRaw += 8;
	/* Current split bucket */
	SyBigEndianPack64(zRaw,pEngine->split_bucket);
	zRaw += 8;
	/* Maximum split bucket */
	SyBigEndianPack64(zRaw,pEngine->max_split_bucket);
	zRaw += 8;
	/* Initialize the bucket map */
	pMap = &pEngine->sPageMap;
	/* Fill in the structure */
	pMap->iNum = pHeader->iPage;
	/* Next page in the bucket map */
	SyBigEndianPack64(zRaw,0);
	zRaw += 8;
	/* Total number of records in the bucket map */
	SyBigEndianPack32(zRaw,0);
	zRaw += 4;
	pMap->iPtr = (sxu16)(zRaw - pHeader->zData);
	/* All done */
	return UNQLITE_OK;
 }